

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

string * __thiscall
google::protobuf::UninterpretedOption::mutable_aggregate_value_abi_cxx11_(UninterpretedOption *this)

{
  string *this_00;
  UninterpretedOption *this_local;
  
  set_has_aggregate_value(this);
  if (this->aggregate_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00);
    this->aggregate_value_ = this_00;
  }
  return this->aggregate_value_;
}

Assistant:

inline ::std::string* UninterpretedOption::mutable_aggregate_value() {
  set_has_aggregate_value();
  if (aggregate_value_ == &::google::protobuf::internal::kEmptyString) {
    aggregate_value_ = new ::std::string;
  }
  return aggregate_value_;
}